

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

void __thiscall duckdb::BlobStatsUnifier::~BlobStatsUnifier(BlobStatsUnifier *this)

{
  ColumnStatsUnifier::~ColumnStatsUnifier((ColumnStatsUnifier *)this);
  operator_delete(this);
  return;
}

Assistant:

string StatsToString(const string &stats) override {
		// convert blobs to hexadecimal
		auto data = const_data_ptr_cast(stats.c_str());
		auto len = stats.size();
		string result;
		result.reserve(len * 2);
		for (idx_t i = 0; i < len; i++) {
			auto byte_a = data[i] >> 4;
			auto byte_b = data[i] & 0x0F;
			result += Blob::HEX_TABLE[byte_a];
			result += Blob::HEX_TABLE[byte_b];
		}
		return result;
	}